

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PretransformVertices.cpp
# Opt level: O3

void __thiscall
Assimp::PretransformVertices::CollectData
          (PretransformVertices *this,aiScene *pcScene,aiNode *pcNode,uint iMat,uint iVFormat,
          aiMesh *pcMeshOut,uint *aiCurrent,uint *num_refs)

{
  aiMatrix4x4 *paVar1;
  uint *puVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  aiMesh *pcMesh;
  aiVector3D *paVar10;
  aiVector3D *paVar11;
  aiFace *paVar12;
  aiFace *paVar13;
  bool bVar14;
  uint uVar15;
  uint uVar16;
  long lVar18;
  aiMatrix4x4t<float> *paVar19;
  uint *puVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  aiMatrix4x4 mWorldIT;
  aiBone **ppaVar17;
  
  paVar1 = &pcNode->mTransformation;
  if (((((((0.01 < ABS((pcNode->mTransformation).a2)) || (0.01 < ABS((pcNode->mTransformation).a3)))
         || (0.01 < ABS((pcNode->mTransformation).a4))) ||
        ((0.01 < ABS((pcNode->mTransformation).b1) || (0.01 < ABS((pcNode->mTransformation).b3)))))
       || ((0.01 < ABS((pcNode->mTransformation).b4) ||
           ((0.01 < ABS((pcNode->mTransformation).c1) || (0.01 < ABS((pcNode->mTransformation).c2)))
           )))) || (0.01 < ABS((pcNode->mTransformation).c4))) ||
     (((0.01 < ABS((pcNode->mTransformation).d1) || (0.01 < ABS((pcNode->mTransformation).d2))) ||
      (0.01 < ABS((pcNode->mTransformation).d3))))) {
    bVar14 = false;
  }
  else {
    bVar14 = false;
    if ((paVar1->a1 <= 1.01) && (0.99 <= paVar1->a1)) {
      fVar26 = (pcNode->mTransformation).b2;
      bVar14 = false;
      if ((fVar26 <= 1.01) && (0.99 <= fVar26)) {
        fVar26 = (pcNode->mTransformation).c3;
        bVar14 = false;
        if ((fVar26 <= 1.01) && (0.99 <= fVar26)) {
          fVar26 = (pcNode->mTransformation).d4;
          if (fVar26 <= 1.01) {
            bVar14 = 0.99 <= fVar26;
          }
          else {
            bVar14 = false;
          }
        }
      }
    }
  }
  if (pcNode->mNumMeshes != 0) {
    uVar24 = 0;
    do {
      pcMesh = pcScene->mMeshes[pcNode->mMeshes[uVar24]];
      if (pcMesh->mMaterialIndex == iMat) {
        ppaVar17 = pcMesh->mBones;
        if (ppaVar17 == (aiBone **)0x0) {
          uVar15 = GetMeshVFormatUnique(pcMesh);
          ppaVar17 = (aiBone **)(ulong)uVar15;
          pcMesh->mBones = (aiBone **)(ulong)uVar15;
        }
        if ((uint)ppaVar17 == iVFormat) {
          uVar15 = pcNode->mMeshes[uVar24];
          if (num_refs[uVar15] == 0) {
            __assert_fail("0 != num_ref",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/PretransformVertices.cpp"
                          ,0xa7,
                          "void Assimp::PretransformVertices::CollectData(aiScene *, aiNode *, unsigned int, unsigned int, aiMesh *, unsigned int *, unsigned int *)"
                         );
          }
          uVar16 = num_refs[uVar15] - 1;
          num_refs[uVar15] = uVar16;
          if ((pcMesh != pcMeshOut) && (uVar16 == 0)) {
            uVar16 = (pcMesh->mName).length;
            (pcMeshOut->mName).length = uVar16;
            memcpy((pcMeshOut->mName).data,(pcMesh->mName).data,(ulong)uVar16);
            (pcMeshOut->mName).data[uVar16] = '\0';
          }
          if (bVar14) {
            memcpy(pcMeshOut->mVertices + *aiCurrent,pcMesh->mVertices,
                   (ulong)pcMesh->mNumVertices * 0xc);
            if ((iVFormat & 2) != 0) {
              memcpy(pcMeshOut->mNormals + *aiCurrent,pcMesh->mNormals,
                     (ulong)pcMesh->mNumVertices * 0xc);
            }
            if ((iVFormat & 4) != 0) {
              memcpy(pcMeshOut->mTangents + *aiCurrent,pcMesh->mTangents,
                     (ulong)pcMesh->mNumVertices * 0xc);
              memcpy(pcMeshOut->mBitangents + *aiCurrent,pcMesh->mBitangents,
                     (ulong)pcMesh->mNumVertices * 0xc);
            }
          }
          else {
            if (pcMesh->mNumVertices != 0) {
              lVar18 = 8;
              uVar25 = 0;
              do {
                paVar10 = pcMesh->mVertices;
                fVar26 = *(float *)((long)paVar10 + lVar18 + -8);
                fVar29 = *(float *)((long)paVar10 + lVar18 + -4);
                fVar3 = *(float *)((long)&paVar10->x + lVar18);
                fVar27 = (pcNode->mTransformation).b2;
                fVar28 = (pcNode->mTransformation).b1;
                fVar4 = (pcNode->mTransformation).b3;
                fVar5 = (pcNode->mTransformation).b4;
                fVar6 = (pcNode->mTransformation).c2;
                fVar7 = (pcNode->mTransformation).c1;
                fVar8 = (pcNode->mTransformation).c3;
                fVar9 = (pcNode->mTransformation).c4;
                paVar11 = pcMeshOut->mVertices;
                uVar16 = *aiCurrent + (int)uVar25;
                paVar10 = paVar11 + uVar16;
                paVar10->x = (pcNode->mTransformation).a4 +
                             fVar3 * (pcNode->mTransformation).a3 +
                             fVar26 * (pcNode->mTransformation).a1 +
                             (pcNode->mTransformation).a2 * fVar29;
                paVar10->y = fVar5 + fVar3 * fVar4 + fVar26 * fVar28 + fVar27 * fVar29;
                paVar11[uVar16].z = fVar3 * fVar8 + fVar26 * fVar7 + fVar29 * fVar6 + fVar9;
                uVar25 = uVar25 + 1;
                lVar18 = lVar18 + 0xc;
              } while (uVar25 < pcMesh->mNumVertices);
            }
            mWorldIT.a1 = paVar1->a1;
            mWorldIT.a2 = paVar1->a2;
            mWorldIT.a3 = (pcNode->mTransformation).a3;
            mWorldIT.a4 = (pcNode->mTransformation).a4;
            mWorldIT.b1 = (pcNode->mTransformation).b1;
            mWorldIT.b2 = (pcNode->mTransformation).b2;
            mWorldIT.b3 = (pcNode->mTransformation).b3;
            mWorldIT.b4 = (pcNode->mTransformation).b4;
            mWorldIT.c1 = (pcNode->mTransformation).c1;
            mWorldIT.c2 = (pcNode->mTransformation).c2;
            mWorldIT.c3 = (pcNode->mTransformation).c3;
            mWorldIT.c4 = (pcNode->mTransformation).c4;
            mWorldIT.d1 = (pcNode->mTransformation).d1;
            mWorldIT.d2 = (pcNode->mTransformation).d2;
            mWorldIT.d3 = (pcNode->mTransformation).d3;
            mWorldIT.d4 = (pcNode->mTransformation).d4;
            paVar19 = aiMatrix4x4t<float>::Inverse(&mWorldIT);
            fVar26 = paVar19->b1;
            paVar19->b1 = paVar19->a2;
            paVar19->a2 = fVar26;
            fVar26 = paVar19->c1;
            paVar19->c1 = paVar19->a3;
            paVar19->a3 = fVar26;
            fVar26 = paVar19->c2;
            paVar19->c2 = paVar19->b3;
            paVar19->b3 = fVar26;
            fVar26 = paVar19->d1;
            paVar19->d1 = paVar19->a4;
            paVar19->a4 = fVar26;
            fVar26 = paVar19->d2;
            paVar19->d2 = paVar19->b4;
            paVar19->b4 = fVar26;
            fVar26 = paVar19->d3;
            paVar19->d3 = paVar19->c4;
            paVar19->c4 = fVar26;
            if (((iVFormat & 2) != 0) && (pcMesh->mNumVertices != 0)) {
              lVar18 = 8;
              uVar25 = 0;
              do {
                paVar10 = pcMesh->mNormals;
                fVar26 = *(float *)((long)paVar10 + lVar18 + -8);
                fVar29 = *(float *)((long)paVar10 + lVar18 + -4);
                fVar3 = *(float *)((long)&paVar10->x + lVar18);
                fVar27 = fVar3 * mWorldIT.a3 + fVar26 * mWorldIT.a1 + fVar29 * mWorldIT.a2;
                fVar28 = fVar3 * mWorldIT.b3 + fVar26 * mWorldIT.b1 + fVar29 * mWorldIT.b2;
                fVar29 = mWorldIT.c3 * fVar3 + mWorldIT.c1 * fVar26 + mWorldIT.c2 * fVar29;
                fVar26 = 1.0 / SQRT(fVar29 * fVar29 + fVar27 * fVar27 + fVar28 * fVar28);
                paVar11 = pcMeshOut->mNormals;
                uVar16 = *aiCurrent + (int)uVar25;
                paVar10 = paVar11 + uVar16;
                paVar10->x = fVar26 * fVar27;
                paVar10->y = fVar26 * fVar28;
                paVar11[uVar16].z = fVar29 * fVar26;
                uVar25 = uVar25 + 1;
                lVar18 = lVar18 + 0xc;
              } while (uVar25 < pcMesh->mNumVertices);
            }
            if (((iVFormat & 4) != 0) && (pcMesh->mNumVertices != 0)) {
              lVar18 = 8;
              uVar25 = 0;
              do {
                paVar10 = pcMesh->mTangents;
                fVar26 = *(float *)((long)paVar10 + lVar18 + -8);
                fVar29 = *(float *)((long)paVar10 + lVar18 + -4);
                fVar3 = *(float *)((long)&paVar10->x + lVar18);
                fVar27 = mWorldIT.c3 * fVar3 + mWorldIT.c1 * fVar26 + mWorldIT.c2 * fVar29;
                fVar28 = fVar3 * mWorldIT.a3 + fVar26 * mWorldIT.a1 + fVar29 * mWorldIT.a2;
                fVar29 = fVar3 * mWorldIT.b3 + fVar26 * mWorldIT.b1 + fVar29 * mWorldIT.b2;
                fVar26 = 1.0 / SQRT(fVar27 * fVar27 + fVar28 * fVar28 + fVar29 * fVar29);
                paVar11 = pcMeshOut->mTangents;
                uVar16 = *aiCurrent + (int)uVar25;
                paVar10 = paVar11 + uVar16;
                paVar10->x = fVar26 * fVar28;
                paVar10->y = fVar26 * fVar29;
                paVar11[uVar16].z = fVar27 * fVar26;
                paVar10 = pcMesh->mBitangents;
                fVar26 = *(float *)((long)paVar10 + lVar18 + -8);
                fVar29 = *(float *)((long)paVar10 + lVar18 + -4);
                fVar3 = *(float *)((long)&paVar10->x + lVar18);
                fVar27 = fVar3 * mWorldIT.a3 + fVar26 * mWorldIT.a1 + fVar29 * mWorldIT.a2;
                fVar28 = fVar3 * mWorldIT.b3 + fVar26 * mWorldIT.b1 + fVar29 * mWorldIT.b2;
                fVar29 = mWorldIT.c3 * fVar3 + mWorldIT.c1 * fVar26 + mWorldIT.c2 * fVar29;
                fVar26 = 1.0 / SQRT(fVar29 * fVar29 + fVar27 * fVar27 + fVar28 * fVar28);
                paVar11 = pcMeshOut->mBitangents;
                uVar16 = *aiCurrent + (int)uVar25;
                paVar10 = paVar11 + uVar16;
                paVar10->x = fVar26 * fVar27;
                paVar10->y = fVar26 * fVar28;
                paVar11[uVar16].z = fVar29 * fVar26;
                uVar25 = uVar25 + 1;
                lVar18 = lVar18 + 0xc;
              } while (uVar25 < pcMesh->mNumVertices);
            }
          }
          if ((iVFormat >> 8 & 1) != 0) {
            uVar25 = 0;
            do {
              memcpy(pcMeshOut->mTextureCoords[uVar25] + *aiCurrent,pcMesh->mTextureCoords[uVar25],
                     (ulong)pcMesh->mNumVertices * 0xc);
              uVar16 = (int)uVar25 + 1;
              uVar25 = (ulong)uVar16;
            } while (((iVFormat >> ((byte)uVar16 & 0x1f)) >> 8 & 1) != 0);
          }
          if ((iVFormat >> 0x18 & 1) != 0) {
            uVar25 = 0;
            do {
              memcpy(pcMeshOut->mColors[uVar25] + *aiCurrent,pcMesh->mColors[uVar25],
                     (ulong)pcMesh->mNumVertices << 4);
              uVar16 = (int)uVar25 + 1;
              uVar25 = (ulong)uVar16;
            } while (((iVFormat >> ((byte)uVar16 & 0x1f)) >> 0x18 & 1) != 0);
          }
          if (pcMesh->mNumFaces != 0) {
            uVar25 = 0;
            do {
              paVar12 = pcMesh->mFaces;
              paVar13 = pcMeshOut->mFaces;
              uVar16 = aiCurrent[1] + (int)uVar25;
              uVar23 = (ulong)paVar12[uVar25].mNumIndices;
              paVar13[uVar16].mNumIndices = paVar12[uVar25].mNumIndices;
              if (num_refs[uVar15] == 0) {
                puVar20 = paVar12[uVar25].mIndices;
                paVar13[uVar16].mIndices = puVar20;
                if (uVar23 != 0) {
                  uVar22 = 0;
                  do {
                    puVar2 = puVar20 + uVar22;
                    *puVar2 = *puVar2 + *aiCurrent;
                    uVar22 = uVar22 + 1;
                  } while (uVar23 != uVar22);
                }
              }
              else {
                puVar20 = (uint *)operator_new__(uVar23 * 4);
                paVar13[uVar16].mIndices = puVar20;
                if (uVar23 != 0) {
                  uVar16 = *aiCurrent;
                  uVar22 = 0;
                  do {
                    puVar20[uVar22] = paVar12[uVar25].mIndices[uVar22] + uVar16;
                    uVar22 = uVar22 + 1;
                  } while (uVar23 != uVar22);
                }
              }
              uVar21 = pcMesh->mFaces[uVar25].mNumIndices - 1;
              uVar16 = 8;
              if (uVar21 < 3) {
                uVar16 = *(uint *)(&DAT_001f2ed0 + (ulong)uVar21 * 4);
              }
              pcMeshOut->mPrimitiveTypes = pcMeshOut->mPrimitiveTypes | uVar16;
              uVar25 = uVar25 + 1;
            } while (uVar25 < pcMesh->mNumFaces);
          }
          *aiCurrent = *aiCurrent + pcMesh->mNumVertices;
          aiCurrent[1] = aiCurrent[1] + pcMesh->mNumFaces;
        }
      }
      uVar24 = uVar24 + 1;
    } while (uVar24 < pcNode->mNumMeshes);
  }
  if (pcNode->mNumChildren != 0) {
    uVar24 = 0;
    do {
      CollectData(this,pcScene,pcNode->mChildren[uVar24],iMat,iVFormat,pcMeshOut,aiCurrent,num_refs)
      ;
      uVar24 = uVar24 + 1;
    } while (uVar24 < pcNode->mNumChildren);
  }
  return;
}

Assistant:

void PretransformVertices::CollectData( aiScene* pcScene, aiNode* pcNode, unsigned int iMat,
    unsigned int iVFormat, aiMesh* pcMeshOut,
    unsigned int aiCurrent[2], unsigned int* num_refs)
{
    // No need to multiply if there's no transformation
    const bool identity = pcNode->mTransformation.IsIdentity();
    for (unsigned int i = 0; i < pcNode->mNumMeshes;++i)
    {
        aiMesh* pcMesh = pcScene->mMeshes[ pcNode->mMeshes[i] ];
        if (iMat == pcMesh->mMaterialIndex && iVFormat == GetMeshVFormat(pcMesh))
        {
            // Decrement mesh reference counter
            unsigned int& num_ref = num_refs[pcNode->mMeshes[i]];
            ai_assert(0 != num_ref);
            --num_ref;
            // Save the name of the last mesh
            if (num_ref==0)
            {
                pcMeshOut->mName = pcMesh->mName;
            }

            if (identity)   {
                // copy positions without modifying them
                ::memcpy(pcMeshOut->mVertices + aiCurrent[AI_PTVS_VERTEX],
                    pcMesh->mVertices,
                    pcMesh->mNumVertices * sizeof(aiVector3D));

                if (iVFormat & 0x2) {
                    // copy normals without modifying them
                    ::memcpy(pcMeshOut->mNormals + aiCurrent[AI_PTVS_VERTEX],
                        pcMesh->mNormals,
                        pcMesh->mNumVertices * sizeof(aiVector3D));
                }
                if (iVFormat & 0x4)
                {
                    // copy tangents without modifying them
                    ::memcpy(pcMeshOut->mTangents + aiCurrent[AI_PTVS_VERTEX],
                        pcMesh->mTangents,
                        pcMesh->mNumVertices * sizeof(aiVector3D));
                    // copy bitangents without modifying them
                    ::memcpy(pcMeshOut->mBitangents + aiCurrent[AI_PTVS_VERTEX],
                        pcMesh->mBitangents,
                        pcMesh->mNumVertices * sizeof(aiVector3D));
                }
            }
            else
            {
                // copy positions, transform them to worldspace
                for (unsigned int n = 0; n < pcMesh->mNumVertices;++n)  {
                    pcMeshOut->mVertices[aiCurrent[AI_PTVS_VERTEX]+n] = pcNode->mTransformation * pcMesh->mVertices[n];
                }
                aiMatrix4x4 mWorldIT = pcNode->mTransformation;
                mWorldIT.Inverse().Transpose();

                // TODO: implement Inverse() for aiMatrix3x3
                aiMatrix3x3 m = aiMatrix3x3(mWorldIT);

                if (iVFormat & 0x2)
                {
                    // copy normals, transform them to worldspace
                    for (unsigned int n = 0; n < pcMesh->mNumVertices;++n)  {
                        pcMeshOut->mNormals[aiCurrent[AI_PTVS_VERTEX]+n] =
                            (m * pcMesh->mNormals[n]).Normalize();
                    }
                }
                if (iVFormat & 0x4)
                {
                    // copy tangents and bitangents, transform them to worldspace
                    for (unsigned int n = 0; n < pcMesh->mNumVertices;++n)  {
                        pcMeshOut->mTangents  [aiCurrent[AI_PTVS_VERTEX]+n] = (m * pcMesh->mTangents[n]).Normalize();
                        pcMeshOut->mBitangents[aiCurrent[AI_PTVS_VERTEX]+n] = (m * pcMesh->mBitangents[n]).Normalize();
                    }
                }
            }
            unsigned int p = 0;
            while (iVFormat & (0x100 << p))
            {
                // copy texture coordinates
                memcpy(pcMeshOut->mTextureCoords[p] + aiCurrent[AI_PTVS_VERTEX],
                    pcMesh->mTextureCoords[p],
                    pcMesh->mNumVertices * sizeof(aiVector3D));
                ++p;
            }
            p = 0;
            while (iVFormat & (0x1000000 << p))
            {
                // copy vertex colors
                memcpy(pcMeshOut->mColors[p] + aiCurrent[AI_PTVS_VERTEX],
                    pcMesh->mColors[p],
                    pcMesh->mNumVertices * sizeof(aiColor4D));
                ++p;
            }
            // now we need to copy all faces. since we will delete the source mesh afterwards,
            // we don't need to reallocate the array of indices except if this mesh is
            // referenced multiple times.
            for (unsigned int planck = 0;planck < pcMesh->mNumFaces;++planck)
            {
                aiFace& f_src = pcMesh->mFaces[planck];
                aiFace& f_dst = pcMeshOut->mFaces[aiCurrent[AI_PTVS_FACE]+planck];

                const unsigned int num_idx = f_src.mNumIndices;

                f_dst.mNumIndices = num_idx;

                unsigned int* pi;
                if (!num_ref) { /* if last time the mesh is referenced -> no reallocation */
                    pi = f_dst.mIndices = f_src.mIndices;

                    // offset all vertex indices
                    for (unsigned int hahn = 0; hahn < num_idx;++hahn){
                        pi[hahn] += aiCurrent[AI_PTVS_VERTEX];
                    }
                }
                else {
                    pi = f_dst.mIndices = new unsigned int[num_idx];

                    // copy and offset all vertex indices
                    for (unsigned int hahn = 0; hahn < num_idx;++hahn){
                        pi[hahn] = f_src.mIndices[hahn] + aiCurrent[AI_PTVS_VERTEX];
                    }
                }

                // Update the mPrimitiveTypes member of the mesh
                switch (pcMesh->mFaces[planck].mNumIndices)
                {
                case 0x1:
                    pcMeshOut->mPrimitiveTypes |= aiPrimitiveType_POINT;
                    break;
                case 0x2:
                    pcMeshOut->mPrimitiveTypes |= aiPrimitiveType_LINE;
                    break;
                case 0x3:
                    pcMeshOut->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
                    break;
                default:
                    pcMeshOut->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
                    break;
                };
            }
            aiCurrent[AI_PTVS_VERTEX] += pcMesh->mNumVertices;
            aiCurrent[AI_PTVS_FACE]   += pcMesh->mNumFaces;
        }
    }

    // append all children of us
    for (unsigned int i = 0;i < pcNode->mNumChildren;++i) {
        CollectData(pcScene,pcNode->mChildren[i],iMat,
            iVFormat,pcMeshOut,aiCurrent,num_refs);
    }
}